

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseSnapshot.cpp
# Opt level: O2

DatabaseName * __thiscall
DatabaseSnapshot::allocate_name
          (DatabaseName *__return_storage_ptr__,DatabaseSnapshot *this,string *type)

{
  bool bVar1;
  ostream *poVar2;
  ExclusiveFile lock;
  string fname;
  string local_318;
  string local_2f8;
  string local_2d8;
  string id;
  path local_298;
  string local_258;
  path local_238;
  path local_1f8;
  stringstream ss;
  ostream local_1a8 [376];
  
  while( true ) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    random_hex_string_abi_cxx11_(&id,8);
    poVar2 = std::operator<<(local_1a8,(string *)type);
    poVar2 = std::operator<<(poVar2,".");
    poVar2 = std::operator<<(poVar2,(string *)&id);
    poVar2 = std::operator<<(poVar2,".");
    std::experimental::filesystem::v1::__cxx11::path::string(&local_238._M_pathname,&this->db_name);
    std::operator<<(poVar2,(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::stringbuf::str();
    std::experimental::filesystem::v1::__cxx11::path::
    path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_1f8,&fname);
    std::experimental::filesystem::v1::__cxx11::operator/(&local_238,&this->db_base,&local_1f8);
    std::__cxx11::string::string((string *)&local_258,(string *)&local_238);
    ExclusiveFile::ExclusiveFile(&lock,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::experimental::filesystem::v1::__cxx11::path::~path(&local_238);
    std::experimental::filesystem::v1::__cxx11::path::~path(&local_1f8);
    bVar1 = ExclusiveFile::is_ok(&lock);
    if (bVar1) break;
    ExclusiveFile::~ExclusiveFile(&lock);
    std::__cxx11::string::~string((string *)&fname);
    std::__cxx11::string::~string((string *)&id);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  std::experimental::filesystem::v1::__cxx11::path::path(&local_298,&this->db_base);
  std::__cxx11::string::string((string *)&local_2d8,(string *)type);
  std::__cxx11::string::string((string *)&local_2f8,(string *)&id);
  std::__cxx11::string::string((string *)&local_318,(string *)&fname);
  DatabaseName::DatabaseName(__return_storage_ptr__,&local_298,&local_2d8,&local_2f8,&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_298);
  ExclusiveFile::~ExclusiveFile(&lock);
  std::__cxx11::string::~string((string *)&fname);
  std::__cxx11::string::~string((string *)&id);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

DatabaseName DatabaseSnapshot::allocate_name(const std::string &type) const {
    while (true) {
        // TODO(unknown): limit this to some sane value (like 10000 etc),
        // to avoid infinite loop in exceptional cases.

        std::stringstream ss;
        std::string id(random_hex_string(8));
        ss << type << "." << id << "." << db_name.string();
        std::string fname = ss.str();
        ExclusiveFile lock(db_base / fname);
        if (lock.is_ok()) {
            return DatabaseName(db_base, type, id, fname);
        }
    }
}